

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_> ast;
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  tokens;
  DefaultEvaluator eval;
  Lexer lexer;
  Parser parser;
  stringstream output;
  ifstream source;
  undefined1 local_4f0 [40];
  string local_4c8;
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  local_4a8;
  DefaultEvaluator local_490;
  Lexer local_480;
  Parser local_408;
  undefined1 local_3a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390 [7];
  ios_base local_320 [264];
  istream local_218 [520];
  
  std::ifstream::ifstream
            (local_218,"C:\\Users\\Freddy\\Documents\\GitHub\\ninx\\examples\\example12.txt",_S_bin)
  ;
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"tests","");
  ninx::lexer::Lexer::Lexer(&local_480,local_218,&local_4c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
  }
  ninx::lexer::Lexer::set_verbose(&local_480,true);
  ninx::lexer::Lexer::generate(&local_4a8,&local_480);
  local_3a0._0_8_ = local_3a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"tests","");
  ninx::parser::Parser::Parser(&local_408,&local_4a8,(string *)local_3a0);
  if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
    operator_delete((void *)local_3a0._0_8_,local_390[0]._M_allocated_capacity + 1);
  }
  ninx::parser::Parser::parse((Parser *)local_4f0);
  poVar1 = ninx::parser::element::operator<<((ostream *)&std::cout,(ASTElement *)local_4f0._0_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"############ OUTPUT #############",0x21);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  std::__cxx11::stringstream::stringstream((stringstream *)local_3a0);
  ninx::evaluator::DefaultEvaluator::DefaultEvaluator(&local_490,(ostream *)(local_3a0 + 0x10));
  ninx::evaluator::DefaultEvaluator::evaluate(&local_490,(Block *)local_4f0._0_8_);
  std::__cxx11::stringbuf::str();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_4f0._8_8_,local_4f0._16_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((undefined1 *)local_4f0._8_8_ != local_4f0 + 0x18) {
    operator_delete((void *)local_4f0._8_8_,local_4f0._24_8_ + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_3a0);
  std::ios_base::~ios_base(local_320);
  if ((Block *)local_4f0._0_8_ != (Block *)0x0) {
    (**(code **)(*(long *)local_4f0._0_8_ + 8))();
  }
  std::
  _Hashtable<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_408.operators._M_h);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408.origin._M_dataplus._M_p != &local_408.origin.field_2) {
    operator_delete(local_408.origin._M_dataplus._M_p,
                    local_408.origin.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  ::~vector(&local_4a8);
  if (local_480.reader.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_480.reader.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_480.reader.buffer.super__Vector_base<char,_std::allocator<char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_480.reader.buffer.super__Vector_base<char,_std::allocator<char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480.reader.origin._M_dataplus._M_p != &local_480.reader.origin.field_2) {
    operator_delete(local_480.reader.origin._M_dataplus._M_p,
                    local_480.reader.origin.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480.origin._M_dataplus._M_p != &local_480.origin.field_2) {
    operator_delete(local_480.origin._M_dataplus._M_p,
                    local_480.origin.field_2._M_allocated_capacity + 1);
  }
  std::ifstream::~ifstream(local_218);
  return 0;
}

Assistant:

int main() {
    //std::ifstream source{R"(/Users/freddy/Documents/GitHub/ninx/examples/example11.txt)", std::ios_base::binary};
    std::ifstream source{R"(C:\Users\Freddy\Documents\GitHub\ninx\examples\example12.txt)", std::ios_base::binary};

    Lexer lexer {source, "tests"};
    lexer.set_verbose(true);

    auto tokens = lexer.generate();

    Parser parser{tokens, "tests"};

    auto ast = parser.parse();

    std::cout << *ast << std::endl;

    std::cout << "############ OUTPUT #############" << std::endl;

    std::stringstream output;
    DefaultEvaluator eval {output};
    eval.evaluate(ast.get());

    std::cout << output.str() << std::endl;

    return 0;
}